

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMap.c
# Opt level: O2

void Mpm_ManPerformRound(Mpm_Man_t *p)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *piVar4;
  Mpm_LibLut_t *pMVar5;
  undefined1 auVar6 [16];
  abctime aVar7;
  Mig_Obj_t *pMVar8;
  Mpm_Cut_t *pCut;
  abctime aVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  Mig_Man_t *pMVar13;
  int iVar14;
  ulong uVar15;
  
  aVar7 = Abc_Clock();
  pMVar13 = p->pMig;
  if ((p->vMigRefs).nSize != (pMVar13->vRefs).nSize) {
    __assert_fail("Vec_IntSize(&p->vMigRefs) == Vec_IntSize(&p->pMig->vRefs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                  ,0x32d,"void Mpm_ManPerformRound(Mpm_Man_t *)");
  }
  memcpy((p->vMigRefs).pArray,(pMVar13->vRefs).pArray,(long)pMVar13->nObjs << 2);
  for (iVar14 = 0; pMVar13 = p->pMig, iVar14 < (pMVar13->vCos).nSize; iVar14 = iVar14 + 1) {
    pMVar8 = Mig_ManCo(pMVar13,iVar14);
    if (pMVar8 == (Mig_Obj_t *)0x0) {
      pMVar13 = p->pMig;
      break;
    }
    if ((uint)pMVar8->pFans[0] < 0xfffffffe) {
      pMVar8 = Mig_ObjFanin(pMVar8,0);
    }
    else {
      pMVar8 = (Mig_Obj_t *)0x0;
    }
    Mig_ObjMigRefDec(p,pMVar8);
  }
  p->nCutsMerged = 0;
  pMVar13->iPage = 0;
  iVar14 = 0;
  while (iVar14 < (pMVar13->vPages).nSize) {
    pMVar8 = (Mig_Obj_t *)Vec_PtrEntry(&pMVar13->vPages,iVar14);
    pMVar13 = p->pMig;
    pMVar13->pPage = pMVar8;
    if (pMVar8 == (Mig_Obj_t *)0x0) break;
    for (; (uint)pMVar8->pFans[3] < 0xfffffffe; pMVar8 = pMVar8 + 1) {
      if ((uint)pMVar8->pFans[1] < 0xfffffffe) {
        Mpm_ManDeriveCuts(p,pMVar8);
      }
    }
    pMVar13 = p->pMig;
    iVar14 = pMVar13->iPage + 1;
    pMVar13->iPage = iVar14;
  }
  iVar14 = (pMVar13->vCis).nSize;
  if (iVar14 + pMVar13->nObjs + ~((pMVar13->vCos).nSize + iVar14) != p->pManCuts->nEntries) {
    __assert_fail("Mig_ManCandNum(p->pMig) == p->pManCuts->nEntries",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                  ,0x335,"void Mpm_ManPerformRound(Mpm_Man_t *)");
  }
  piVar2 = (p->vMapRefs).pArray;
  piVar3 = (p->vRequireds).pArray;
  p->GloArea = 0;
  p->GloEdge = 0;
  piVar4 = (p->vTimes).pArray;
  iVar12 = 0;
  iVar14 = 0;
  while ((iVar12 < (pMVar13->vCos).nSize &&
         (pMVar8 = Mig_ManCo(pMVar13,iVar12), pMVar8 != (Mig_Obj_t *)0x0))) {
    iVar1 = piVar4[(uint)pMVar8->pFans[0] >> 1];
    if (iVar14 <= iVar1) {
      iVar14 = iVar1;
    }
    iVar12 = iVar12 + 1;
    pMVar13 = p->pMig;
  }
  p->GloRequired = iVar14;
  iVar12 = p->pPars->DelayTarget;
  if (iVar12 != -1) {
    if (iVar12 < iVar14) {
      iVar12 = iVar14;
    }
    p->GloRequired = iVar12;
  }
  Vec_IntFill(&p->vMapRefs,p->pMig->nObjs,0);
  Vec_IntFill(&p->vRequireds,p->pMig->nObjs,1000000000);
  pMVar13 = p->pMig;
  iVar14 = (pMVar13->vPages).nSize + -1;
  pMVar13->iPage = iVar14;
  while (-1 < iVar14) {
    pMVar8 = (Mig_Obj_t *)Vec_PtrEntry(&pMVar13->vPages,iVar14);
    pMVar13 = p->pMig;
    pMVar13->pPage = pMVar8;
    if (pMVar8 == (Mig_Obj_t *)0x0) break;
    if (pMVar13->iPage == (pMVar13->vPages).nSize + -1) {
      pMVar8 = Mig_ManObj(pMVar13,pMVar13->nObjs + -1);
    }
    else {
      pMVar8 = pMVar8 + 0xfff;
    }
    for (; pMVar13 = p->pMig, -1 < (long)pMVar8 - (long)pMVar13->pPage; pMVar8 = pMVar8 + -1) {
      if ((uint)pMVar8->pFans[1] < 0xfffffffe) {
        uVar10 = (uint)pMVar8->pFans[3] >> 1;
        iVar14 = piVar3[uVar10];
        if (iVar14 < 1) {
          __assert_fail("Required > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/mpm/mpmMap.c"
                        ,0x2c2,"void Mpm_ManFinalizeRound(Mpm_Man_t *)");
        }
        if (0 < piVar2[uVar10]) {
          pCut = Mpm_ObjCutBestP(p,pMVar8);
          pMVar5 = p->pLibLut;
          uVar10 = *(uint *)&pCut->field_0x4;
          uVar11 = uVar10 >> 0x1b;
          for (uVar15 = 0; uVar15 < uVar10 >> 0x1b; uVar15 = uVar15 + 1) {
            uVar10 = Abc_Lit2Var(pCut->pLeaves[uVar15]);
            iVar12 = iVar14 - pMVar5->pLutDelays[uVar11][uVar15];
            if (piVar3[uVar10] < iVar12) {
              iVar12 = piVar3[uVar10];
            }
            piVar3[uVar10] = iVar12;
            piVar2[uVar10] = piVar2[uVar10] + 1;
            uVar10 = *(uint *)&pCut->field_0x4;
          }
          iVar14 = Mpm_CutGetArea(p,pCut);
          p->GloArea = p->GloArea + (long)iVar14;
          p->GloEdge = p->GloEdge + (ulong)(*(uint *)&pCut->field_0x4 >> 0x1b);
        }
      }
      else if (((uint)pMVar8->pFans[2] < 0xfffffffe) && ((uint)pMVar8->pFans[0] >> 1 < 0x7fffffff))
      {
        piVar3[(uint)pMVar8->pFans[0] >> 1] = p->GloRequired;
        piVar2[(uint)pMVar8->pFans[0] >> 1] = piVar2[(uint)pMVar8->pFans[0] >> 1] + 1;
      }
    }
    iVar14 = pMVar13->iPage + -1;
    pMVar13->iPage = iVar14;
  }
  uVar15 = 0;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = p->GloArea;
  p->GloArea = SUB168(auVar6 / ZEXT816(0x14),0);
  if (p->pPars->fVerbose == 0) {
    return;
  }
  if (p->vTtMem != (Vec_Mem_t *)0x0) {
    uVar15 = (ulong)(uint)p->vTtMem->nEntries;
  }
  iVar14 = 0x731cb9;
  printf("Del =%5d.  Ar =%8d.  Edge =%8d.  Cut =%10d. Max =%8d.  Tru =%8d. Small =%6d. ",
         (ulong)(uint)p->GloRequired,(ulong)SUB164(auVar6 / ZEXT816(0x14),0),(ulong)(uint)p->GloEdge
         ,(ulong)(uint)p->nCutsMerged,(ulong)(uint)p->pManCuts->nEntriesMax,uVar15,
         (ulong)(uint)p->nSmallSupp);
  aVar9 = Abc_Clock();
  Abc_Print(iVar14,"%s =","Time");
  Abc_Print(iVar14,"%9.2f sec\n",SUB84((double)(aVar9 - aVar7) / 1000000.0,0));
  return;
}

Assistant:

void Mpm_ManPerformRound( Mpm_Man_t * p )
{
    Mig_Obj_t * pObj;
    abctime clk = Abc_Clock();
    int i;
    // copy references
    assert( Vec_IntSize(&p->vMigRefs) == Vec_IntSize(&p->pMig->vRefs) );
    memcpy( Vec_IntArray(&p->vMigRefs), Vec_IntArray(&p->pMig->vRefs), sizeof(int) * Mig_ManObjNum(p->pMig) );
    Mig_ManForEachCo( p->pMig, pObj, i )
        Mig_ObjMigRefDec( p, Mig_ObjFanin0(pObj) );
    // derive cuts
    p->nCutsMerged = 0;
    Mig_ManForEachNode( p->pMig, pObj )
        Mpm_ManDeriveCuts( p, pObj );
    assert( Mig_ManCandNum(p->pMig) == p->pManCuts->nEntries );
    Mpm_ManFinalizeRound( p );
    // report results
    if ( p->pPars->fVerbose )
    {
    printf( "Del =%5d.  Ar =%8d.  Edge =%8d.  Cut =%10d. Max =%8d.  Tru =%8d. Small =%6d. ", 
        p->GloRequired, (int)p->GloArea, (int)p->GloEdge, 
        p->nCutsMerged, p->pManCuts->nEntriesMax, 
        p->vTtMem ? p->vTtMem->nEntries : 0, p->nSmallSupp );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }
}